

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *this;
  undefined1 *puVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  value_type local_c44 [2];
  value_type local_c3c [2];
  value_type local_c34;
  value_type local_c30;
  value_type local_c2c [2];
  value_type local_c24 [2];
  value_type local_c1c [2];
  value_type local_c14 [2];
  value_type local_c0c [2];
  value_type local_c04 [2];
  allocator<int> local_bf9;
  deque<int,_ft::allocator<int>_> local_bf8;
  undefined1 local_b80 [8];
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ftBar;
  deque<int,_ft::allocator<int>_> local_b00;
  undefined1 local_a88 [8];
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ftFoo;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stdBar;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stdFoo;
  stack<char,_ft::vector<char,_ft::allocator<char>_>_> ft_4;
  stack<char,_std::vector<char,_std::allocator<char>_>_> std_4;
  undefined1 local_930 [8];
  vector<char,_ft::allocator<char>_> ftL;
  undefined1 local_908 [8];
  vector<char,_std::allocator<char>_> stdL;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8e8;
  undefined1 local_870 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ft_3;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  std_3;
  value_type local_7a0;
  allocator<char> local_779;
  value_type local_778;
  allocator<char> local_751;
  value_type local_750;
  allocator<char> local_729;
  value_type local_728;
  allocator<char> local_701;
  value_type local_700;
  allocator<char> local_6d9;
  value_type local_6d8;
  allocator<char> local_6b1;
  value_type local_6b0;
  allocator<char> local_689;
  value_type local_688;
  allocator<char> local_661;
  value_type local_660;
  allocator<char> local_639;
  value_type local_638;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_611;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  undefined1 local_598 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ftCopy_1;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stdCopy_1;
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  stack<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  int i_1;
  undefined1 local_388 [8];
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ftCopy;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stdCopy;
  double local_2b8;
  int local_2b0;
  allocator<double> local_2a9;
  int i;
  undefined1 local_230 [8];
  stack<double,_ft::deque<double,_ft::allocator<double>_>_> ft_1;
  stack<double,_std::deque<double,_std::allocator<double>_>_> std_1;
  allocator<char> local_151;
  deque<char,_ft::allocator<char>_> local_150;
  undefined1 local_d8 [8];
  stack<char,_ft::deque<char,_ft::allocator<char>_>_> ft;
  stack<char,_std::deque<char,_std::allocator<char>_>_> std;
  
  ::std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,std::deque<char,std::allocator<char>>> *)&ft.c.field_0x70);
  ::ft::allocator<char>::allocator(&local_151);
  ::ft::deque<char,_ft::allocator<char>_>::deque(&local_150,&local_151);
  ::ft::stack<char,_ft::deque<char,_ft::allocator<char>_>_>::stack
            ((stack<char,_ft::deque<char,_ft::allocator<char>_>_> *)local_d8,&local_150);
  ::ft::deque<char,_ft::allocator<char>_>::~deque(&local_150);
  ::ft::allocator<char>::~allocator(&local_151);
  bVar2 = ::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::empty
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&ft.c.field_0x70);
  if (bVar2) {
    poVar3 = ::std::operator<<((ostream *)&::std::cout,"std is empty");
    ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  }
  bVar2 = ::ft::stack<char,_ft::deque<char,_ft::allocator<char>_>_>::empty
                    ((stack<char,_ft::deque<char,_ft::allocator<char>_>_> *)local_d8);
  if (bVar2) {
    poVar3 = ::std::operator<<((ostream *)&::std::cout," ft is empty");
    ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  }
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  sVar4 = ::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::size
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&ft.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar4);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  sVar5 = ::ft::stack<char,_ft::deque<char,_ft::allocator<char>_>_>::size
                    ((stack<char,_ft::deque<char,_ft::allocator<char>_>_> *)local_d8);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar5);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::ft::stack<char,_ft::deque<char,_ft::allocator<char>_>_>::~stack
            ((stack<char,_ft::deque<char,_ft::allocator<char>_>_> *)local_d8);
  ::std::stack<char,_std::deque<char,_std::allocator<char>_>_>::~stack
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&ft.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,std::deque<double,std::allocator<double>>> *)&ft_1.c.field_0x70);
  ::ft::allocator<double>::allocator(&local_2a9);
  ::ft::deque<double,_ft::allocator<double>_>::deque
            ((deque<double,_ft::allocator<double>_> *)&i,&local_2a9);
  ::ft::stack<double,_ft::deque<double,_ft::allocator<double>_>_>::stack
            ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_230,
             (container_type *)&i);
  ::ft::deque<double,_ft::allocator<double>_>::~deque((deque<double,_ft::allocator<double>_> *)&i);
  ::ft::allocator<double>::~allocator(&local_2a9);
  for (local_2b0 = 1; local_2b0 < 8; local_2b0 = local_2b0 + 1) {
    local_2b8 = (double)local_2b0 / 3.0;
    ::std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
              ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&ft_1.c.field_0x70,
               &local_2b8);
    stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node = (_Map_pointer)((double)local_2b0 / 3.0);
    ::ft::stack<double,_ft::deque<double,_ft::allocator<double>_>_>::push
              ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_230,
               (value_type_conflict1 *)
               &stdCopy.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
  }
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  sVar6 = ::std::stack<double,_std::deque<double,_std::allocator<double>_>_>::size
                    ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                     &ft_1.c.field_0x70);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar6);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  sVar5 = ::ft::stack<double,_ft::deque<double,_ft::allocator<double>_>_>::size
                    ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_230);
  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,sVar5);
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  print<std::stack<double,std::deque<double,std::allocator<double>>>>
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&ft_1.c.field_0x70,"std"
            );
  print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
            ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_230,"ft");
  ::ft::stack<double,_ft::deque<double,_ft::allocator<double>_>_>::~stack
            ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_230);
  ::std::stack<double,_std::deque<double,_std::allocator<double>_>_>::~stack
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&ft_1.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&ftCopy.c.field_0x70);
  this = (allocator<int> *)
         ((long)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                 ._M_finish._M_node + 7);
  ::ft::allocator<int>::allocator(this);
  ::ft::deque<int,_ft::allocator<int>_>::deque((deque<int,_ft::allocator<int>_> *)&i_1,this);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_388,(container_type *)&i_1);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)&i_1);
  ::ft::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 7));
  for (std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish
       ._M_node._0_4_ = 1;
      (int)std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node < 6;
      std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._0_4_ =
           (int)std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node + 1) {
    ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70,
               (value_type *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
    ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
              ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_388,
               (value_type *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
  }
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70,
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_388);
  print<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70,"std");
  print<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,"ft");
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::~stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)
             &stdCopy_1.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft_2.c.field_0x70);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::~stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_388);
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftCopy.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&ftCopy_1.c.field_0x70);
  ::ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator(&local_611);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&local_610,&local_611);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_598,&local_610);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_610);
  ::ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator(&local_611);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"what\'s",&local_639);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&ftCopy_1.c.field_0x70,&local_638);
  ::std::__cxx11::string::~string((string *)&local_638);
  ::std::allocator<char>::~allocator(&local_639);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"in",&local_661);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&ftCopy_1.c.field_0x70,&local_660);
  ::std::__cxx11::string::~string((string *)&local_660);
  ::std::allocator<char>::~allocator(&local_661);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"the",&local_689);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&ftCopy_1.c.field_0x70,&local_688);
  ::std::__cxx11::string::~string((string *)&local_688);
  ::std::allocator<char>::~allocator(&local_689);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"fucking",&local_6b1);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&ftCopy_1.c.field_0x70,&local_6b0);
  ::std::__cxx11::string::~string((string *)&local_6b0);
  ::std::allocator<char>::~allocator(&local_6b1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"box",&local_6d9);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&ftCopy_1.c.field_0x70,&local_6d8);
  ::std::__cxx11::string::~string((string *)&local_6d8);
  ::std::allocator<char>::~allocator(&local_6d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"what\'s",&local_701);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_598,&local_700);
  ::std::__cxx11::string::~string((string *)&local_700);
  ::std::allocator<char>::~allocator(&local_701);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"in",&local_729);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_598,&local_728);
  ::std::__cxx11::string::~string((string *)&local_728);
  ::std::allocator<char>::~allocator(&local_729);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"the",&local_751);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_598,&local_750);
  ::std::__cxx11::string::~string((string *)&local_750);
  ::std::allocator<char>::~allocator(&local_751);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"fucking",&local_779);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_598,&local_778);
  ::std::__cxx11::string::~string((string *)&local_778);
  ::std::allocator<char>::~allocator(&local_779);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"box",
             (allocator<char> *)
             ((long)&std_3.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_598,&local_7a0);
  ::std::__cxx11::string::~string((string *)&local_7a0);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&std_3.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node + 7));
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&ft_3.c.field_0x70);
  puVar1 = &stdL.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17;
  ::ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)puVar1);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&local_8e8,(allocator_type *)puVar1);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_870,&local_8e8);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_8e8);
  ::ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stdL.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&ft_3.c.field_0x70,
              (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&ftCopy_1.c.field_0x70);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_870,
              (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_598);
  print<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ft_3.c.field_0x70,"std");
  print<ft::stack<std::__cxx11::string,ft::deque<std::__cxx11::string,ft::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_870,"ft");
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_870);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&ft_3.c.field_0x70);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_598);
  ::std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&ftCopy_1.c.field_0x70);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ftL._31_1_ = 0x7e;
  ::std::allocator<char>::allocator();
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_908,3,&ftL.field_0x1f,
             (allocator_type *)&ftL.field_0x1e);
  ::std::allocator<char>::~allocator((allocator<char> *)&ftL.field_0x1e);
  std_4.c.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0x7e;
  puVar1 = &std_4.c.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16;
  ::ft::allocator<char>::allocator((allocator<char> *)puVar1);
  ::ft::vector<char,_ft::allocator<char>_>::vector
            ((vector<char,_ft::allocator<char>_> *)local_930,3,
             &std_4.c.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17,
             (allocator_type *)puVar1);
  ::ft::allocator<char>::~allocator
            ((allocator<char> *)
             &std_4.c.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x16);
  ::std::stack<char,_std::vector<char,_std::allocator<char>_>_>::stack
            ((stack<char,_std::vector<char,_std::allocator<char>_>_> *)&ft_4.c.field_0x18,
             (vector<char,_std::allocator<char>_> *)local_908);
  ::ft::stack<char,_ft::vector<char,_ft::allocator<char>_>_>::stack
            ((stack<char,_ft::vector<char,_ft::allocator<char>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(container_type *)local_930);
  print<std::stack<char,std::vector<char,std::allocator<char>>>>
            ((stack<char,_std::vector<char,_std::allocator<char>_>_> *)&ft_4.c.field_0x18,"std");
  print<ft::stack<char,ft::vector<char,ft::allocator<char>>>>
            ((stack<char,_ft::vector<char,_ft::allocator<char>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"ft");
  ::ft::stack<char,_ft::vector<char,_ft::allocator<char>_>_>::~stack
            ((stack<char,_ft::vector<char,_ft::allocator<char>_>_> *)
             &stdFoo.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::stack<char,_std::vector<char,_std::allocator<char>_>_>::~stack
            ((stack<char,_std::vector<char,_std::allocator<char>_>_> *)&ft_4.c.field_0x18);
  ::ft::vector<char,_ft::allocator<char>_>::~vector((vector<char,_ft::allocator<char>_> *)local_930)
  ;
  ::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_908);
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::ostream::operator<<(poVar3,::std::endl<char,std::char_traits<char>>);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&ftFoo.c.field_0x70);
  puVar1 = &ftBar.c.field_0x77;
  ::ft::allocator<int>::allocator((allocator<int> *)puVar1);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_b00,(allocator_type *)puVar1);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,&local_b00);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_b00);
  ::ft::allocator<int>::~allocator((allocator<int> *)&ftBar.c.field_0x77);
  ::ft::allocator<int>::allocator(&local_bf9);
  ::ft::deque<int,_ft::allocator<int>_>::deque(&local_bf8,&local_bf9);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,&local_bf8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque(&local_bf8);
  ::ft::allocator<int>::~allocator(&local_bf9);
  local_c04[1] = 5;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_c04 + 1);
  local_c04[0] = 5;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_c04);
  local_c0c[1] = 5;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,local_c0c + 1);
  local_c0c[0] = 5;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,local_c0c);
  local_c14[1] = 0xb;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_c14 + 1);
  local_c14[0] = 0xb;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_c14);
  local_c1c[1] = 0xb;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,local_c1c + 1);
  local_c1c[0] = 0xb;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,local_c1c);
  local_c24[1] = 0x13;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,local_c24 + 1);
  local_c24[0] = 0x13;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_c24);
  local_c2c[1] = 0x13;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,local_c2c + 1);
  local_c2c[0] = 0x13;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,local_c2c);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,"ftBar");
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  local_c30 = 0x15;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,&local_c30);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::pop
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88);
  local_c34 = 0x15;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,&local_c34);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,"ftBar");
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70);
  local_c3c[1] = 0x15;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_c3c + 1
            );
  local_c3c[0] = 3;
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,local_c3c);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::pop
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80);
  local_c44[1] = 0x15;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,local_c44 + 1);
  local_c44[0] = 3;
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::push
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,local_c44);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80,"ftBar");
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::~stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_b80);
  ::ft::stack<int,_ft::deque<int,_ft::allocator<int>_>_>::~stack
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a88);
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ftFoo.c.field_0x70);
  ::std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &stdBar.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::stack<char>	std;
		ft::stack<char>		ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and top
		std::stack<double>	std;
		ft::stack<double>	ft;

		for (int i = 1; i <= 7; ++i) {
			std.push(i / 3.0);
			ft.push(i / 3.0);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::stack<int>	stdCopy;
		ft::stack<int>	ftCopy;

		for (int i = 1; i <= 5; ++i) {
			stdCopy.push(i);
			ftCopy.push(i);
		}

		std::stack<int>	std(stdCopy);
		ft::stack<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::stack<std::string>	stdCopy;
		ft::stack<std::string>	ftCopy;

		stdCopy.push("what's");
		stdCopy.push("in");
		stdCopy.push("the");
		stdCopy.push("fucking");
		stdCopy.push("box");

		ftCopy.push("what's");
		ftCopy.push("in");
		ftCopy.push("the");
		ftCopy.push("fucking");
		ftCopy.push("box");

		std::stack<std::string>	std;
		ft::stack<std::string>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::vector<char>	stdL(3, '~');
		ft::vector<char>	ftL(3, '~');

		std::stack<char, std::vector<char> >	std(stdL);
		ft::stack<char, ft::vector<char> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::stack<int>	stdFoo, stdBar;
		ft::stack<int>	ftFoo, ftBar;

		stdFoo.push(5);
		stdBar.push(5);
		ftFoo.push(5);
		ftBar.push(5);

		stdFoo.push(11);
		stdBar.push(11);
		ftFoo.push(11);
		ftBar.push(11);

		stdFoo.push(19);
		stdBar.push(19);
		ftFoo.push(19);
		ftBar.push(19);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(21);
		ftFoo.pop();
		ftFoo.push(21);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(21);
		stdBar.push(3);
		ftBar.pop();
		ftBar.push(21);
		ftBar.push(3);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}